

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O2

uint __thiscall
crnlib::mipmapped_texture::get_total_pixels_in_all_faces_and_mips(mipmapped_texture *this)

{
  vector<crnlib::mip_level_*> *pvVar1;
  mip_level *pmVar2;
  uint uVar3;
  uint l;
  ulong uVar4;
  uint m;
  ulong uVar5;
  
  pvVar1 = (this->m_faces).m_p;
  uVar3 = 0;
  for (uVar4 = 0; uVar4 != (this->m_faces).m_size; uVar4 = uVar4 + 1) {
    for (uVar5 = 0; pvVar1[uVar4].m_size != uVar5; uVar5 = uVar5 + 1) {
      pmVar2 = pvVar1[uVar4].m_p[uVar5];
      uVar3 = uVar3 + pmVar2->m_height * pmVar2->m_width;
    }
  }
  return uVar3;
}

Assistant:

uint mipmapped_texture::get_total_pixels_in_all_faces_and_mips() const {
  uint total_pixels = 0;
  for (uint l = 0; l < m_faces.size(); l++)
    for (uint m = 0; m < m_faces[l].size(); m++)
      total_pixels += m_faces[l][m]->get_total_pixels();

  return total_pixels;
}